

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_stm(DisasContext_conflict13 *s,DisasOps *o)

{
  int iVar1;
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 arg;
  TCGv_i64 addr;
  uint uVar2;
  uint uVar3;
  int mem_index;
  TCGv_i64 arg2;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = get_field1(s,FLD_O_r1,FLD_C_b1);
  uVar3 = get_field1(s,FLD_O_r3,FLD_C_i3);
  iVar1 = (int)s->insn->data;
  arg2 = tcg_const_i64_s390x(tcg_ctx,(long)iVar1);
  while( true ) {
    arg = tcg_ctx->regs[(int)uVar2];
    addr = o->in2;
    mem_index = get_mem_index(s);
    if (iVar1 == 8) {
      tcg_gen_qemu_st64(tcg_ctx,arg,addr,mem_index);
    }
    else {
      tcg_gen_qemu_st32(tcg_ctx,arg,addr,mem_index);
    }
    if (uVar2 == uVar3) break;
    tcg_gen_add_i64(tcg_ctx,o->in2,o->in2,arg2);
    uVar2 = uVar2 + 1 & 0xf;
  }
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static bool op_stm(DisasContext *s, arg_ldst_block *a, int min_n)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int i, j, n, list, mem_idx;
    bool user = a->u;
    TCGv_i32 addr, tmp, tmp2;

    if (user) {
        /* STM (user) */
        if (IS_USER(s)) {
            /* Only usable in supervisor mode.  */
            unallocated_encoding(s);
            return true;
        }
    }

    list = a->list;
    n = ctpop16(list);
    if (n < min_n || a->rn == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = op_addr_block_pre(s, a, n);
    mem_idx = get_mem_index(s);

    for (i = j = 0; i < 16; i++) {
        if (!(list & (1 << i))) {
            continue;
        }

        if (user && i != 15) {
            tmp = tcg_temp_new_i32(tcg_ctx);
            tmp2 = tcg_const_i32(tcg_ctx, i);
            gen_helper_get_user_reg(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp2);
            tcg_temp_free_i32(tcg_ctx, tmp2);
        } else {
            tmp = load_reg(s, i);
        }
        gen_aa32_st32(s, tmp, addr, mem_idx);
        tcg_temp_free_i32(tcg_ctx, tmp);

        /* No need to add after the last transfer.  */
        if (++j != n) {
            tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
        }
    }

    op_addr_block_post(s, a, addr, n);
    return true;
}